

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptAsyncFunction.cpp
# Opt level: O2

Var Js::JavascriptAsyncFunction::EntryAsyncFunctionImplementation
              (RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *scriptContext;
  JavascriptLibrary *this;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  JavascriptAsyncFunction *pJVar4;
  JavascriptGenerator *generator;
  JavascriptPromise *pJVar5;
  int in_stack_00000010;
  undefined1 local_38 [8];
  ArgumentReader args;
  CallInfo callInfo_local;
  
  scriptContext =
       (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
       scriptContext.ptr;
  args.super_Arguments.Values = (Type)callInfo;
  ThreadContext::ProbeStack(scriptContext->threadContext,0xc00,scriptContext,(PVOID)0x0);
  if (callInfo._0_4_ != in_stack_00000010) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptAsyncFunction.cpp"
                                ,0x2d,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)local_38,(CallInfo *)&args.super_Arguments.Values,
             (Var *)&stack0x00000018);
  this = (scriptContext->super_ScriptContextBase).javascriptLibrary;
  pJVar4 = VarTo<Js::JavascriptAsyncFunction,Js::RecyclableObject>(function);
  generator = JavascriptLibrary::CreateGenerator
                        (this,(Arguments *)local_38,
                         &((pJVar4->super_JavascriptGeneratorFunction).scriptFunction.ptr)->
                          super_ScriptFunction,(this->super_JavascriptLibraryBase).nullValue.ptr);
  pJVar5 = BeginAsyncFunctionExecution(generator);
  return pJVar5;
}

Assistant:

Var JavascriptAsyncFunction::EntryAsyncFunctionImplementation(
    RecyclableObject* function,
    CallInfo callInfo, ...)
{
    auto* scriptContext = function->GetScriptContext();
    PROBE_STACK(scriptContext, Js::Constants::MinStackDefault);
    ARGUMENTS(args, callInfo);

    auto* library = scriptContext->GetLibrary();
    auto* asyncFn = VarTo<JavascriptAsyncFunction>(function);
    auto* scriptFn = asyncFn->GetGeneratorVirtualScriptFunction();
    auto* generator = library->CreateGenerator(args, scriptFn, library->GetNull());

    return BeginAsyncFunctionExecution(generator);
}